

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O2

void __thiscall cmPipeConnection::Connect(cmPipeConnection *this,uv_stream_t *server)

{
  uv_stream_ptr *this_00;
  cmServerBase *pcVar1;
  int iVar2;
  uv_stream_s *puVar3;
  uv_loop_t *puVar4;
  uv_stream_t *puVar5;
  uv_pipe_ptr ClientPipe;
  uv_handle_ptr_base_<uv_pipe_s> local_38;
  __shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = &(this->super_cmEventBasedConnection).WriteStream;
  puVar3 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                     (&this_00->super_uv_handle_ptr_base_<uv_stream_s>);
  if (puVar3 == (uv_stream_s *)0x0) {
    local_38.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_38,(EVP_PKEY_CTX *)puVar4);
    puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_38);
    iVar2 = uv_accept(server,puVar5);
    if (iVar2 == 0) {
      puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_38);
      uv_read_start(puVar5,cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
      ::cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_pipe_ptr,void>
                ((uv_handle_ptr_base_<uv_stream_s> *)&local_28,(uv_pipe_ptr *)&local_38);
      std::__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)this_00,&local_28);
      ::cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
                ((uv_handle_ptr_base_<uv_stream_s> *)&local_28);
      pcVar1 = (this->super_cmEventBasedConnection).super_cmConnection.Server;
      (*pcVar1->_vptr_cmServerBase[4])(pcVar1,this);
    }
  }
  else {
    local_38.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_38,(EVP_PKEY_CTX *)puVar4);
    puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_38);
    uv_accept(server,puVar5);
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_38);
  return;
}

Assistant:

void cmPipeConnection::Connect(uv_stream_t* server)
{
  if (this->WriteStream.get()) {
    // Accept and close all pipes but the first:
    cm::uv_pipe_ptr rejectPipe;

    rejectPipe.init(*this->Server->GetLoop(), 0);
    uv_accept(server, rejectPipe);

    return;
  }

  cm::uv_pipe_ptr ClientPipe;
  ClientPipe.init(*this->Server->GetLoop(), 0,
                  static_cast<cmEventBasedConnection*>(this));

  if (uv_accept(server, ClientPipe) != 0) {
    return;
  }

  uv_read_start(ClientPipe, on_alloc_buffer, on_read);
  WriteStream = std::move(ClientPipe);
  Server->OnConnected(this);
}